

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O1

ChStreamOutBinary * __thiscall
chrono::ChStreamOutBinary::operator<<(ChStreamOutBinary *this,float Val)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  _func_int **pp_Var3;
  long lVar4;
  float *pfVar5;
  float tmp;
  undefined4 local_10;
  float local_c;
  
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    puVar2 = (undefined1 *)((long)&local_10 + 3);
    local_10 = Val;
    lVar4 = 0;
    do {
      uVar1 = *(undefined1 *)((long)&local_10 + lVar4);
      *(undefined1 *)((long)&local_10 + lVar4) = *puVar2;
      *puVar2 = uVar1;
      lVar4 = lVar4 + 1;
      puVar2 = puVar2 + -1;
    } while (lVar4 == 1);
    pp_Var3 = (this->super_ChStreamOut)._vptr_ChStreamOut;
    pfVar5 = (float *)&local_10;
  }
  else {
    pp_Var3 = (this->super_ChStreamOut)._vptr_ChStreamOut;
    pfVar5 = &local_c;
  }
  local_c = Val;
  (*pp_Var3[2])(this,pfVar5,4);
  return this;
}

Assistant:

ChStreamOutBinary& ChStreamOutBinary::operator<<(const float Val) {
    if (big_endian_machine) {
        float tmp = Val;
        StreamSwapBytes<float>(&tmp);
        this->Output((char*)&tmp, sizeof(float));
    } else {
        this->Output((char*)&Val, sizeof(float));
    }
    return (*this);
}